

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(void)

{
  void *pvVar1;
  char local_38 [8];
  char timebuf [32];
  void *list;
  
  timebuf._24_8_ = rmlLinkedListCreate();
  rmlLinkedListPush((void *)timebuf._24_8_,"C");
  rmlLinkedListPush((void *)timebuf._24_8_,"C++");
  rmlLinkedListPush((void *)timebuf._24_8_,"Python");
  rmlLinkedListPush((void *)timebuf._24_8_,"JavaScript");
  rmlLinkedListPush((void *)timebuf._24_8_,"TypeScript");
  rmlLinkedListPush((void *)timebuf._24_8_,"C#");
  rmlLinkedListPush((void *)timebuf._24_8_,"Rust");
  rmlLinkedListPop((void *)timebuf._24_8_);
  rmlLinkedListShift((void *)timebuf._24_8_);
  rmlLinkedListRemove((void *)timebuf._24_8_,1);
  rmlLinkedListEach((void *)timebuf._24_8_,eachCallback,(void *)0x0);
  rml_get_current_local_time(local_38,0x20);
  printf("[%s] %s(%d) [%s] ",local_38,
         "/workspace/llm4binary/github/license_all_cmakelists_25/plter[P]rml/examples/test_linkedlist/main.c"
         ,0x1d,"INFO");
  pvVar1 = rmlLinkedListGet((void *)timebuf._24_8_,2);
  printf("Value at index 2: %s",pvVar1);
  printf("\n");
  rmlLinkedListDestroy((void *)timebuf._24_8_);
  return 0;
}

Assistant:

int main() {

    void *list = rmlLinkedListCreate();
    rmlLinkedListPush(list, "C");
    rmlLinkedListPush(list, "C++");
    rmlLinkedListPush(list, "Python");
    rmlLinkedListPush(list, "JavaScript");
    rmlLinkedListPush(list, "TypeScript");
    rmlLinkedListPush(list, "C#");
    rmlLinkedListPush(list, "Rust");
    rmlLinkedListPop(list);
    rmlLinkedListShift(list);
    rmlLinkedListRemove(list, 1);

    rmlLinkedListEach(list, &eachCallback, NULL);

    RML_INFO("Value at index 2: %s", (char *) rmlLinkedListGet(list, 2));

    rmlLinkedListDestroy(list);
    return 0;
}